

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O1

void cmFortranParser_RuleSubmodule(cmFortranParser *parser,char *module_name,char *submodule_name)

{
  cmFortranSourceInfo *pcVar1;
  undefined1 *puVar2;
  cmFortranParser_s *this;
  allocator<char> local_81;
  undefined1 local_80 [32];
  string local_60;
  string local_40;
  
  if (parser->InPPFalseBranch == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,module_name,(allocator<char> *)local_80);
    cmsys::SystemTools::LowerCase(&local_40,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)local_80,submodule_name,&local_81);
    this = (cmFortranParser_s *)local_80;
    cmsys::SystemTools::LowerCase(&local_60,(string *)this);
    puVar2 = local_80 + 0x10;
    if ((undefined1 *)local_80._0_8_ != puVar2) {
      this = (cmFortranParser_s *)(local_80._16_8_ + 1);
      operator_delete((void *)local_80._0_8_,(ulong)this);
    }
    pcVar1 = parser->Info;
    cmFortranParser_s::ModName((string *)local_80,this,&local_40);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&pcVar1->Requires,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
    if ((undefined1 *)local_80._0_8_ != puVar2) {
      operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
    }
    pcVar1 = parser->Info;
    cmFortranParser_s::SModName((string *)local_80,parser,&local_40,&local_60);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&pcVar1->Provides,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
    if ((undefined1 *)local_80._0_8_ != puVar2) {
      operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmFortranParser_RuleSubmodule(cmFortranParser* parser,
                                   const char* module_name,
                                   const char* submodule_name)
{
  if (parser->InPPFalseBranch) {
    return;
  }

  // syntax:   "submodule (module_name) submodule_name"
  // requires: "module_name.mod"
  // provides: "module_name@submodule_name.smod"
  //
  // FIXME: Some compilers split the submodule part of a module into a
  // separate "module_name.smod" file.  Whether it is generated or
  // not depends on conditions more subtle than we currently detect.
  // For now we depend directly on "module_name.mod".

  std::string const& mod_name = cmSystemTools::LowerCase(module_name);
  std::string const& sub_name = cmSystemTools::LowerCase(submodule_name);
  parser->Info.Requires.insert(parser->ModName(mod_name));
  parser->Info.Provides.insert(parser->SModName(mod_name, sub_name));
}